

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::DPIImportSyntax::setChild(DPIImportSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSVar1;
  SyntaxNode *pSVar2;
  logic_error *this_00;
  Token TVar3;
  FunctionPrototypeSyntax *local_188;
  string local_160;
  allocator<char> local_129;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined8 local_88;
  Info *local_80;
  FunctionPrototypeSyntax *local_78;
  FunctionPrototypeSyntax *local_70;
  undefined8 local_68;
  Info *local_60;
  undefined8 local_58;
  Info *local_50;
  undefined8 local_48;
  Info *local_40;
  undefined8 local_38;
  Info *local_30;
  undefined8 local_28;
  Info *local_20;
  size_t local_18;
  size_t index_local;
  DPIImportSyntax *this_local;
  
  local_18 = index;
  index_local = (size_t)this;
  switch(index) {
  case 0:
    pSVar2 = TokenOrSyntax::node(&child);
    pSVar1 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>>
                       (pSVar2);
    SyntaxList<slang::syntax::AttributeInstanceSyntax>::operator=
              (&(this->super_MemberSyntax).attributes,pSVar1);
    break;
  case 1:
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_28 = TVar3._0_8_;
    (this->keyword).kind = (undefined2)local_28;
    (this->keyword).field_0x2 = local_28._2_1_;
    (this->keyword).numFlags = (NumericTokenFlags)local_28._3_1_;
    (this->keyword).rawLen = local_28._4_4_;
    local_20 = TVar3.info;
    (this->keyword).info = local_20;
    break;
  case 2:
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_38 = TVar3._0_8_;
    (this->specString).kind = (undefined2)local_38;
    (this->specString).field_0x2 = local_38._2_1_;
    (this->specString).numFlags = (NumericTokenFlags)local_38._3_1_;
    (this->specString).rawLen = local_38._4_4_;
    local_30 = TVar3.info;
    (this->specString).info = local_30;
    break;
  case 3:
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_48 = TVar3._0_8_;
    (this->property).kind = (undefined2)local_48;
    (this->property).field_0x2 = local_48._2_1_;
    (this->property).numFlags = (NumericTokenFlags)local_48._3_1_;
    (this->property).rawLen = local_48._4_4_;
    local_40 = TVar3.info;
    (this->property).info = local_40;
    break;
  case 4:
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_58 = TVar3._0_8_;
    (this->c_identifier).kind = (undefined2)local_58;
    (this->c_identifier).field_0x2 = local_58._2_1_;
    (this->c_identifier).numFlags = (NumericTokenFlags)local_58._3_1_;
    (this->c_identifier).rawLen = local_58._4_4_;
    local_50 = TVar3.info;
    (this->c_identifier).info = local_50;
    break;
  case 5:
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_68 = TVar3._0_8_;
    (this->equals).kind = (undefined2)local_68;
    (this->equals).field_0x2 = local_68._2_1_;
    (this->equals).numFlags = (NumericTokenFlags)local_68._3_1_;
    (this->equals).rawLen = local_68._4_4_;
    local_60 = TVar3.info;
    (this->equals).info = local_60;
    break;
  case 6:
    pSVar2 = TokenOrSyntax::node(&child);
    if (pSVar2 == (SyntaxNode *)0x0) {
      local_188 = (FunctionPrototypeSyntax *)0x0;
    }
    else {
      pSVar2 = TokenOrSyntax::node(&child);
      local_188 = SyntaxNode::as<slang::syntax::FunctionPrototypeSyntax>(pSVar2);
    }
    local_78 = local_188;
    not_null<slang::syntax::FunctionPrototypeSyntax*>::
    not_null<slang::syntax::FunctionPrototypeSyntax*,void>
              ((not_null<slang::syntax::FunctionPrototypeSyntax*> *)&local_70,&local_78);
    (this->method).ptr = local_70;
    break;
  case 7:
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_88 = TVar3._0_8_;
    (this->semi).kind = (undefined2)local_88;
    (this->semi).field_0x2 = local_88._2_1_;
    (this->semi).numFlags = (NumericTokenFlags)local_88._3_1_;
    (this->semi).rawLen = local_88._4_4_;
    local_80 = TVar3.info;
    (this->semi).info = local_80;
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_128,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O0/extern/slang/source/AllSyntax.cpp"
               ,&local_129);
    std::operator+(&local_108,&local_128,":");
    std::__cxx11::to_string(&local_160,0xe10);
    std::operator+(&local_e8,&local_108,&local_160);
    std::operator+(&local_c8,&local_e8,": ");
    std::operator+(&local_a8,&local_c8,"Default case should be unreachable!");
    std::logic_error::logic_error(this_00,(string *)&local_a8);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

void DPIImportSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: keyword = child.token(); return;
        case 2: specString = child.token(); return;
        case 3: property = child.token(); return;
        case 4: c_identifier = child.token(); return;
        case 5: equals = child.token(); return;
        case 6: method = child.node() ? &child.node()->as<FunctionPrototypeSyntax>() : nullptr; return;
        case 7: semi = child.token(); return;
        default: ASSUME_UNREACHABLE;
    }
}